

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O1

CURLcode cw_download_write(Curl_easy *data,Curl_cwriter *writer,int type,char *buf,size_t nbytes)

{
  undefined1 *puVar1;
  byte *pbVar2;
  uint uVar3;
  void *pvVar4;
  Curl_cwriter *pCVar5;
  curl_trc_feat *pcVar6;
  CURLcode CVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  ulong local_38;
  
  if (((type & 0x10U) == 0) && (pvVar4 = writer->ctx, (*(byte *)((long)pvVar4 + 0x20) & 1) == 0)) {
    Curl_pgrsTime(data,TIMER_STARTTRANSFER);
    pbVar2 = (byte *)((long)pvVar4 + 0x20);
    *pbVar2 = *pbVar2 | 1;
  }
  if ((type & 1U) == 0) {
    if (((type & 0x10U) != 0) && (((data->set).field_0x8cf & 8) != 0)) {
      return CURLE_OK;
    }
    pCVar5 = writer->next;
    if (pCVar5 == (Curl_cwriter *)0x0) {
      uVar10 = 0x17;
    }
    else {
      CVar7 = (*pCVar5->cwt->do_write)(data,pCVar5,type,buf,nbytes);
      uVar10 = (ulong)CVar7;
    }
    CVar7 = (CURLcode)uVar10;
    if (data == (Curl_easy *)0x0) {
      return CVar7;
    }
    if (((data->set).field_0x8cd & 0x10) == 0) {
      return CVar7;
    }
    pcVar6 = (data->state).feat;
    if ((pcVar6 != (curl_trc_feat *)0x0) && (pcVar6->log_level < 1)) {
      return CVar7;
    }
    if (Curl_trc_feat_write.log_level < 1) {
      return CVar7;
    }
    Curl_trc_write(data,"download_write header(type=%x, blen=%zu) -> %d",(ulong)(uint)type,nbytes,
                   uVar10);
    return CVar7;
  }
  uVar3 = *(uint *)&(data->req).field_0xd9;
  if (nbytes != 0 && (uVar3 >> 0x11 & 1) != 0) {
    Curl_conncontrol(data->conn,2);
    if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
        ((pcVar6 = (data->state).feat, pcVar6 == (curl_trc_feat *)0x0 || (0 < pcVar6->log_level))))
       && (0 < Curl_trc_feat_write.log_level)) {
      Curl_trc_write(data,"download_write body(type=%x, blen=%zu), did not want a BODY",
                     (ulong)(uint)type,nbytes);
    }
    puVar1 = &(data->req).field_0xd9;
    *puVar1 = *puVar1 | 8;
    return (uint)((data->info).header_size == 0) << 3;
  }
  lVar9 = (data->req).maxdownload;
  if (lVar9 == -1) {
    local_38 = 0;
    uVar10 = nbytes;
  }
  else {
    uVar10 = lVar9 - (data->req).bytecount;
    if ((long)uVar10 < 1) {
      uVar10 = 0;
    }
    bVar11 = nbytes < uVar10;
    local_38 = nbytes - uVar10;
    if (bVar11) {
      local_38 = 0;
    }
    if (bVar11 || nbytes - uVar10 == 0) {
      uVar10 = nbytes;
    }
    if (!bVar11) {
      *(uint *)&(data->req).field_0xd9 = uVar3 | 8;
    }
    if ((((char)type < '\0') && (((data->req).field_0xdb & 2) == 0)) &&
       ((data->req).bytecount < lVar9)) {
      Curl_failf(data,"end of response with %ld bytes missing");
      return CURLE_PARTIAL_FILE;
    }
  }
  uVar8 = (data->set).max_filesize;
  if (uVar8 != 0xffffffffffffffff) {
    if (uVar8 == 0) goto LAB_0014f4f9;
    uVar8 = uVar8 - (data->req).bytecount;
    if ((long)uVar8 < 1) {
      uVar8 = 0;
    }
  }
  if (uVar8 <= uVar10) {
    uVar10 = uVar8;
  }
LAB_0014f4f9:
  if ((((data->req).field_0xda & 4) == 0) && (((char)type < '\0' || (uVar10 != 0)))) {
    pCVar5 = writer->next;
    if (pCVar5 == (Curl_cwriter *)0x0) {
      uVar8 = 0x17;
    }
    else {
      CVar7 = (*pCVar5->cwt->do_write)(data,pCVar5,type,buf,uVar10);
      uVar8 = (ulong)CVar7;
    }
    if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
       (((pcVar6 = (data->state).feat, pcVar6 == (curl_trc_feat *)0x0 || (0 < pcVar6->log_level)) &&
        (0 < Curl_trc_feat_write.log_level)))) {
      Curl_trc_write(data,"download_write body(type=%x, blen=%zu) -> %d",(ulong)(uint)type,nbytes,
                     uVar8);
    }
    if ((CURLcode)uVar8 != CURLE_OK) {
      return (CURLcode)uVar8;
    }
  }
  lVar9 = (data->req).bytecount + uVar10;
  (data->req).bytecount = lVar9;
  CVar7 = Curl_pgrsSetDownloadCounter(data,lVar9);
  if (CVar7 == CURLE_OK) {
    CVar7 = CURLE_OK;
    if (local_38 == 0) {
      if ((uVar10 < nbytes) && (((data->req).field_0xda & 4) == 0)) {
        Curl_failf(data,"Exceeded the maximum allowed file size (%ld) with %ld bytes",
                   (data->set).max_filesize,(data->req).bytecount);
        CVar7 = CURLE_FILESIZE_EXCEEDED;
      }
    }
    else if (((data->req).field_0xda & 4) == 0) {
      if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
         ((pcVar6 = (data->state).feat, pcVar6 == (curl_trc_feat *)0x0 || (0 < pcVar6->log_level))))
      {
        Curl_infof(data,
                   "Excess found writing body: excess = %zu, size = %ld, maxdownload = %ld, bytecount = %ld"
                   ,local_38,(data->req).size,(data->req).maxdownload,(data->req).bytecount);
      }
      Curl_conncontrol(data->conn,1);
    }
  }
  return CVar7;
}

Assistant:

static CURLcode cw_download_write(struct Curl_easy *data,
                                  struct Curl_cwriter *writer, int type,
                                  const char *buf, size_t nbytes)
{
  struct cw_download_ctx *ctx = writer->ctx;
  CURLcode result;
  size_t nwrite, excess_len = 0;
  bool is_connect = !!(type & CLIENTWRITE_CONNECT);

  if(!is_connect && !ctx->started_response) {
    Curl_pgrsTime(data, TIMER_STARTTRANSFER);
    ctx->started_response = TRUE;
  }

  if(!(type & CLIENTWRITE_BODY)) {
    if(is_connect && data->set.suppress_connect_headers)
      return CURLE_OK;
    result = Curl_cwriter_write(data, writer->next, type, buf, nbytes);
    CURL_TRC_WRITE(data, "download_write header(type=%x, blen=%zu) -> %d",
                   type, nbytes, result);
    return result;
  }

  /* Here, we deal with REAL BODY bytes. All filtering and transfer
   * encodings have been applied and only the true content, e.g. BODY,
   * bytes are passed here.
   * This allows us to check sizes, update stats, etc. independent
   * from the protocol in play. */

  if(data->req.no_body && nbytes > 0) {
    /* BODY arrives although we want none, bail out */
    streamclose(data->conn, "ignoring body");
    CURL_TRC_WRITE(data, "download_write body(type=%x, blen=%zu), "
                   "did not want a BODY", type, nbytes);
    data->req.download_done = TRUE;
    if(data->info.header_size)
      /* if headers have been received, this is fine */
      return CURLE_OK;
    return CURLE_WEIRD_SERVER_REPLY;
  }

  /* Determine if we see any bytes in excess to what is allowed.
   * We write the allowed bytes and handle excess further below.
   * This gives deterministic BODY writes on varying buffer receive
   * lengths. */
  nwrite = nbytes;
  if(-1 != data->req.maxdownload) {
    size_t wmax = get_max_body_write_len(data, data->req.maxdownload);
    if(nwrite > wmax) {
      excess_len = nbytes - wmax;
      nwrite = wmax;
    }

    if(nwrite == wmax) {
      data->req.download_done = TRUE;
    }

    if((type & CLIENTWRITE_EOS) && !data->req.no_body &&
       (data->req.maxdownload > data->req.bytecount)) {
      failf(data, "end of response with %" FMT_OFF_T " bytes missing",
            data->req.maxdownload - data->req.bytecount);
      return CURLE_PARTIAL_FILE;
    }
  }

  /* Error on too large filesize is handled below, after writing
   * the permitted bytes */
  if(data->set.max_filesize) {
    size_t wmax = get_max_body_write_len(data, data->set.max_filesize);
    if(nwrite > wmax) {
      nwrite = wmax;
    }
  }

  if(!data->req.ignorebody && (nwrite || (type & CLIENTWRITE_EOS))) {
    result = Curl_cwriter_write(data, writer->next, type, buf, nwrite);
    CURL_TRC_WRITE(data, "download_write body(type=%x, blen=%zu) -> %d",
                   type, nbytes, result);
    if(result)
      return result;
  }
  /* Update stats, write and report progress */
  data->req.bytecount += nwrite;
#ifdef USE_HYPER
  data->req.bodywritten = TRUE;
#endif
  result = Curl_pgrsSetDownloadCounter(data, data->req.bytecount);
  if(result)
    return result;

  if(excess_len) {
    if(!data->req.ignorebody) {
      infof(data,
            "Excess found writing body:"
            " excess = %zu"
            ", size = %" FMT_OFF_T
            ", maxdownload = %" FMT_OFF_T
            ", bytecount = %" FMT_OFF_T,
            excess_len, data->req.size, data->req.maxdownload,
            data->req.bytecount);
      connclose(data->conn, "excess found in a read");
    }
  }
  else if((nwrite < nbytes) && !data->req.ignorebody) {
    failf(data, "Exceeded the maximum allowed file size "
          "(%" FMT_OFF_T ") with %" FMT_OFF_T " bytes",
          data->set.max_filesize, data->req.bytecount);
    return CURLE_FILESIZE_EXCEEDED;
  }

  return CURLE_OK;
}